

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O0

void flatbuffers::PrintVector<flatbuffers::Offset<void>>
               (Vector<flatbuffers::Offset<void>_> *v,Type type,int indent,int indent_step,
               string *_text)

{
  bool bVar1;
  uoffset_t uVar2;
  char *pcVar3;
  void *val;
  return_type val_00;
  uint local_2c;
  uoffset_t i;
  string *text;
  string *_text_local;
  int indent_step_local;
  int indent_local;
  Vector<flatbuffers::Offset<void>_> *v_local;
  
  std::__cxx11::string::operator+=((string *)_text,"[");
  pcVar3 = NewLine(indent_step);
  std::__cxx11::string::operator+=((string *)_text,pcVar3);
  local_2c = 0;
  while( true ) {
    uVar2 = Vector<flatbuffers::Offset<void>_>::Length(v);
    if (uVar2 <= local_2c) break;
    if (local_2c != 0) {
      std::__cxx11::string::operator+=((string *)_text,",");
      pcVar3 = NewLine(indent_step);
      std::__cxx11::string::operator+=((string *)_text,pcVar3);
    }
    std::__cxx11::string::append((ulong)_text,(char)indent + (char)indent_step);
    bVar1 = IsStruct(&type);
    if (bVar1) {
      val = Vector<flatbuffers::Offset<void>_>::GetStructFromOffset
                      (v,(ulong)local_2c * (type.struct_def)->bytesize);
      Print<void_const*>(val,type,indent + indent_step,indent_step,(StructDef *)0x0,_text);
    }
    else {
      val_00 = Vector<flatbuffers::Offset<void>_>::Get(v,local_2c);
      Print<void_const*>(val_00,type,indent + indent_step,indent_step,(StructDef *)0x0,_text);
    }
    local_2c = local_2c + 1;
  }
  pcVar3 = NewLine(indent_step);
  std::__cxx11::string::operator+=((string *)_text,pcVar3);
  std::__cxx11::string::append((ulong)_text,(char)indent);
  std::__cxx11::string::operator+=((string *)_text,"]");
  return;
}

Assistant:

void PrintVector(const Vector<T> &v, Type type,
                                      int indent, int indent_step,
                                      std::string *_text) {
  std::string &text = *_text;
  text += "[";
  text += NewLine(indent_step);
  for (uoffset_t i = 0; i < v.Length(); i++) {
    if (i) {
      text += ",";
      text += NewLine(indent_step);
    }
    text.append(indent + indent_step, ' ');
    if (IsStruct(type))
      Print(v.GetStructFromOffset(i * type.struct_def->bytesize), type,
            indent + indent_step, indent_step, nullptr, _text);
    else
      Print(v.Get(i), type, indent + indent_step, indent_step, nullptr, _text);
  }
  text += NewLine(indent_step);
  text.append(indent, ' ');
  text += "]";
}